

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O3

void __thiscall
InplaceSolverIslandCallback::setup
          (InplaceSolverIslandCallback *this,btContactSolverInfo *solverInfo,
          btTypedConstraint **sortedConstraints,int numConstraints,btIDebugDraw *debugDrawer)

{
  btCollisionObject **ptr;
  btPersistentManifold **ptr_00;
  btTypedConstraint **ptr_01;
  int i;
  long lVar1;
  
  this->m_solverInfo = solverInfo;
  this->m_sortedConstraints = sortedConstraints;
  this->m_numConstraints = numConstraints;
  this->m_debugDrawer = debugDrawer;
  lVar1 = (long)(this->m_bodies).m_size;
  if (lVar1 < 0) {
    if ((this->m_bodies).m_capacity < 0) {
      ptr = (this->m_bodies).m_data;
      if ((ptr != (btCollisionObject **)0x0) && ((this->m_bodies).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
      }
      (this->m_bodies).m_ownsMemory = true;
      (this->m_bodies).m_data = (btCollisionObject **)0x0;
      (this->m_bodies).m_capacity = 0;
    }
    do {
      (this->m_bodies).m_data[lVar1] = (btCollisionObject *)0x0;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0);
  }
  (this->m_bodies).m_size = 0;
  lVar1 = (long)(this->m_manifolds).m_size;
  if (lVar1 < 0) {
    if ((this->m_manifolds).m_capacity < 0) {
      ptr_00 = (this->m_manifolds).m_data;
      if ((ptr_00 != (btPersistentManifold **)0x0) && ((this->m_manifolds).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr_00);
      }
      (this->m_manifolds).m_ownsMemory = true;
      (this->m_manifolds).m_data = (btPersistentManifold **)0x0;
      (this->m_manifolds).m_capacity = 0;
    }
    do {
      (this->m_manifolds).m_data[lVar1] = (btPersistentManifold *)0x0;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0);
  }
  (this->m_manifolds).m_size = 0;
  lVar1 = (long)(this->m_constraints).m_size;
  if (lVar1 < 0) {
    if ((this->m_constraints).m_capacity < 0) {
      ptr_01 = (this->m_constraints).m_data;
      if ((ptr_01 != (btTypedConstraint **)0x0) && ((this->m_constraints).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr_01);
      }
      (this->m_constraints).m_ownsMemory = true;
      (this->m_constraints).m_data = (btTypedConstraint **)0x0;
      (this->m_constraints).m_capacity = 0;
    }
    do {
      (this->m_constraints).m_data[lVar1] = (btTypedConstraint *)0x0;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0);
  }
  (this->m_constraints).m_size = 0;
  return;
}

Assistant:

SIMD_FORCE_INLINE void setup ( btContactSolverInfo* solverInfo, btTypedConstraint** sortedConstraints,	int	numConstraints,	btIDebugDraw* debugDrawer)
	{
		btAssert(solverInfo);
		m_solverInfo = solverInfo;
		m_sortedConstraints = sortedConstraints;
		m_numConstraints = numConstraints;
		m_debugDrawer = debugDrawer;
		m_bodies.resize (0);
		m_manifolds.resize (0);
		m_constraints.resize (0);
	}